

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bipart.cpp
# Opt level: O3

Dist * Omega_h::bi_partition(Dist *__return_storage_ptr__,CommPtr *comm,Read<signed_char> *marks)

{
  int *piVar1;
  Alloc *pAVar2;
  Dist *this;
  bool bVar3;
  uint uVar4;
  I32 IVar5;
  undefined4 extraout_var;
  Alloc *pAVar6;
  long total;
  long offset;
  undefined8 uVar7;
  char *pcVar8;
  LO LVar9;
  bool bVar10;
  char *pcVar11;
  int b;
  ulong uVar12;
  Remotes dests;
  LOs marked;
  Write<int> dest_idxs;
  Write<int> dest_ranks;
  Read<long> globals;
  undefined1 local_1c8 [32];
  ulong local_1a8;
  LO local_19c;
  ulong local_198;
  Alloc *local_190;
  void *local_188;
  Write<int> local_180;
  Write<int> local_170;
  Write<int> local_160;
  LOs local_150;
  Read<int> local_140;
  Write<int> local_130;
  LOs local_120;
  Read<int> local_110;
  Read<long> local_100;
  Read<signed_char> local_f0;
  Read<signed_char> local_e0;
  CommPtr local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  Read<long> local_a0;
  Remotes local_90;
  Dist *local_70;
  Read<signed_char> *local_68;
  Read<signed_char> local_60;
  Read<signed_char> local_50;
  Read<int> local_40;
  
  uVar4 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((uVar4 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "To use bi_partiion, please run with an even number of MPI ranks.",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  uVar4 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((uVar4 & 1) == 0) {
    uVar4 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    local_1a8 = CONCAT44(extraout_var,uVar4);
    if ((uVar4 & 1) == 0) {
      pAVar6 = (marks->write_).shared_alloc_.alloc;
      if (((ulong)pAVar6 & 1) == 0) {
        LVar9 = (LO)pAVar6->size;
      }
      else {
        LVar9 = (LO)((ulong)pAVar6 >> 3);
      }
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
      Write<int>::Write(&local_170,LVar9,(string *)local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      pAVar6 = (marks->write_).shared_alloc_.alloc;
      if (((ulong)pAVar6 & 1) == 0) {
        LVar9 = (LO)pAVar6->size;
      }
      else {
        LVar9 = (LO)((ulong)pAVar6 >> 3);
      }
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
      Write<int>::Write(&local_180,LVar9,(string *)local_1c8);
      local_70 = __return_storage_ptr__;
      if ((Alloc *)local_1c8._0_8_ != (Alloc *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      local_1a8 = (ulong)(uint)((int)local_1a8 >> 1);
      local_19c = -1;
      local_198 = 0;
      bVar3 = true;
      local_68 = marks;
      do {
        bVar10 = bVar3;
        local_e0.write_.shared_alloc_.alloc = (marks->write_).shared_alloc_.alloc;
        if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_e0.write_.shared_alloc_.alloc =
                 (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_e0.write_.shared_alloc_.alloc)->use_count =
                 (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_e0.write_.shared_alloc_.direct_ptr = (marks->write_).shared_alloc_.direct_ptr;
        invert_marks((Omega_h *)local_1c8,&local_e0);
        pAVar6 = (marks->write_).shared_alloc_.alloc;
        if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
          piVar1 = &pAVar6->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar6);
            operator_delete(pAVar6,0x48);
          }
        }
        (marks->write_).shared_alloc_.alloc = (Alloc *)local_1c8._0_8_;
        (marks->write_).shared_alloc_.direct_ptr = (void *)local_1c8._8_8_;
        pAVar6 = (Alloc *)local_1c8._0_8_;
        if (((local_1c8._0_8_ & 7) == 0 && (Alloc *)local_1c8._0_8_ != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          *(int *)(local_1c8._0_8_ + 0x30) = *(int *)(local_1c8._0_8_ + 0x30) + -1;
          pAVar6 = (Alloc *)(*(long *)local_1c8._0_8_ * 8 + 1);
          (marks->write_).shared_alloc_.alloc = pAVar6;
        }
        pAVar2 = local_e0.write_.shared_alloc_.alloc;
        local_1c8._0_8_ = (pointer)0x0;
        local_1c8._8_8_ = (void *)0x0;
        if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
            pAVar6 = (marks->write_).shared_alloc_.alloc;
          }
        }
        local_f0.write_.shared_alloc_.alloc = pAVar6;
        if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_f0.write_.shared_alloc_.alloc = (Alloc *)(pAVar6->size * 8 + 1);
          }
          else {
            pAVar6->use_count = pAVar6->use_count + 1;
          }
        }
        local_f0.write_.shared_alloc_.direct_ptr = (marks->write_).shared_alloc_.direct_ptr;
        collect_marked((Omega_h *)&local_190,&local_f0);
        pAVar6 = local_f0.write_.shared_alloc_.alloc;
        if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar6);
            operator_delete(pAVar6,0x48);
          }
        }
        if (((ulong)local_190 & 1) == 0) {
          uVar12 = local_190->size;
        }
        else {
          uVar12 = (ulong)local_190 >> 3;
        }
        total = Comm::allreduce<long>
                          ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,(long)(int)(uVar12 >> 2),OMEGA_H_SUM);
        if (((ulong)local_190 & 1) == 0) {
          uVar12 = local_190->size;
        }
        else {
          uVar12 = (ulong)local_190 >> 3;
        }
        offset = Comm::exscan<long>((comm->
                                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr,(long)(int)(uVar12 >> 2),OMEGA_H_SUM);
        if (((ulong)local_190 & 1) == 0) {
          uVar12 = local_190->size;
        }
        else {
          uVar12 = (ulong)local_190 >> 3;
        }
        local_1c8._0_8_ = local_1c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
        Read<long>::Read(&local_a0,(LO)(uVar12 >> 2),offset,1,(string *)local_1c8);
        uVar12 = local_198;
        if ((Alloc *)local_1c8._0_8_ != (Alloc *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        local_100.write_.shared_alloc_.alloc = local_a0.write_.shared_alloc_.alloc;
        if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_100.write_.shared_alloc_.alloc =
                 (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_a0.write_.shared_alloc_.alloc)->use_count =
                 (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_100.write_.shared_alloc_.direct_ptr = local_a0.write_.shared_alloc_.direct_ptr;
        globals_to_linear_owners((Remotes *)local_1c8,&local_100,total,(I32)local_1a8);
        pAVar6 = local_100.write_.shared_alloc_.alloc;
        if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
            local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        local_110.write_.shared_alloc_.alloc = (Alloc *)local_1c8._0_8_;
        if ((local_1c8._0_8_ & 7) == 0 && (Alloc *)local_1c8._0_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_110.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1c8._0_8_ * 8 + 1);
          }
          else {
            *(int *)(local_1c8._0_8_ + 0x30) = *(int *)(local_1c8._0_8_ + 0x30) + 1;
          }
        }
        local_110.write_.shared_alloc_.direct_ptr = (void *)local_1c8._8_8_;
        b = (int)uVar12;
        add_to_each<int>((Omega_h *)&local_40,&local_110,b);
        local_120.write_.shared_alloc_.alloc = local_190;
        if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_120.write_.shared_alloc_.alloc = (Alloc *)(local_190->size * 8 + 1);
          }
          else {
            local_190->use_count = local_190->use_count + 1;
          }
        }
        local_120.write_.shared_alloc_.direct_ptr = local_188;
        local_130.shared_alloc_.alloc = local_170.shared_alloc_.alloc;
        if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
            local_170.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_130.shared_alloc_.alloc = (Alloc *)((local_170.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_170.shared_alloc_.alloc)->use_count =
                 (local_170.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_130.shared_alloc_.direct_ptr = local_170.shared_alloc_.direct_ptr;
        map_into<int>(&local_40,&local_120,&local_130,1);
        pAVar6 = local_130.shared_alloc_.alloc;
        if (((ulong)local_130.shared_alloc_.alloc & 7) == 0 &&
            local_130.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_130.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_130.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        pAVar6 = local_120.write_.shared_alloc_.alloc;
        if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
            local_120.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_120.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_120.write_.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        pAVar6 = local_40.write_.shared_alloc_.alloc;
        if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
            local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        pAVar6 = local_110.write_.shared_alloc_.alloc;
        if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
            local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar6);
            operator_delete(pAVar6,0x48);
          }
        }
        local_140.write_.shared_alloc_.alloc = (Alloc *)local_1c8._16_8_;
        if ((local_1c8._16_8_ & 7) == 0 && (Alloc *)local_1c8._16_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_140.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1c8._16_8_ * 8 + 1);
          }
          else {
            *(int *)(local_1c8._16_8_ + 0x30) = *(int *)(local_1c8._16_8_ + 0x30) + 1;
          }
        }
        local_140.write_.shared_alloc_.direct_ptr = (void *)local_1c8._24_8_;
        local_150.write_.shared_alloc_.alloc = local_190;
        if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_150.write_.shared_alloc_.alloc = (Alloc *)(local_190->size * 8 + 1);
          }
          else {
            local_190->use_count = local_190->use_count + 1;
          }
        }
        local_150.write_.shared_alloc_.direct_ptr = local_188;
        local_160.shared_alloc_.alloc = local_180.shared_alloc_.alloc;
        if (((ulong)local_180.shared_alloc_.alloc & 7) == 0 &&
            local_180.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_160.shared_alloc_.alloc = (Alloc *)((local_180.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_180.shared_alloc_.alloc)->use_count =
                 (local_180.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_160.shared_alloc_.direct_ptr = local_180.shared_alloc_.direct_ptr;
        map_into<int>(&local_140,&local_150,&local_160,1);
        pAVar6 = local_160.shared_alloc_.alloc;
        if (((ulong)local_160.shared_alloc_.alloc & 7) == 0 &&
            local_160.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_160.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_160.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        pAVar6 = local_150.write_.shared_alloc_.alloc;
        if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
            local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_150.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        pAVar6 = local_140.write_.shared_alloc_.alloc;
        if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
            local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
        if (IVar5 < b) {
          uVar4 = b + (int)local_1a8;
        }
        else {
          IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
          uVar4 = b + (int)local_1a8;
          if (IVar5 < (int)uVar4) {
            IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
            local_19c = linear_partition_size(total,(I32)local_1a8,IVar5 - b);
          }
        }
        marks = local_68;
        uVar7 = local_1c8._16_8_;
        local_198 = (ulong)uVar4;
        if ((local_1c8._16_8_ & 7) == 0 && (Alloc *)local_1c8._16_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_1c8._16_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_1c8._16_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        uVar7 = local_1c8._0_8_;
        if ((local_1c8._0_8_ & 7) == 0 && (Alloc *)local_1c8._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_1c8._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_1c8._0_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        pAVar6 = local_a0.write_.shared_alloc_.alloc;
        if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
            operator_delete(pAVar6,0x48);
          }
        }
        pAVar6 = local_190;
        if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
          piVar1 = &local_190->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_190);
            operator_delete(pAVar6,0x48);
          }
        }
        this = local_70;
        bVar3 = false;
      } while (bVar10);
      local_b0.shared_alloc_.alloc = local_170.shared_alloc_.alloc;
      if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
          local_170.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0.shared_alloc_.alloc = (Alloc *)((local_170.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_170.shared_alloc_.alloc)->use_count =
               (local_170.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_b0.shared_alloc_.direct_ptr = local_170.shared_alloc_.direct_ptr;
      Read<int>::Read(&local_50,&local_b0);
      local_c0.shared_alloc_.alloc = local_180.shared_alloc_.alloc;
      if (((ulong)local_180.shared_alloc_.alloc & 7) == 0 &&
          local_180.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0.shared_alloc_.alloc = (Alloc *)((local_180.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_180.shared_alloc_.alloc)->use_count =
               (local_180.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_c0.shared_alloc_.direct_ptr = local_180.shared_alloc_.direct_ptr;
      Read<int>::Read(&local_60,&local_c0);
      Remotes::Remotes((Remotes *)local_1c8,(Read<int> *)&local_50,(LOs *)&local_60);
      if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
          operator_delete(local_60.write_.shared_alloc_.alloc,0x48);
        }
      }
      pAVar6 = local_c0.shared_alloc_.alloc;
      if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 &&
          local_c0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_c0.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_c0.shared_alloc_.alloc);
          operator_delete(pAVar6,0x48);
        }
      }
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(local_50.write_.shared_alloc_.alloc,0x48);
        }
      }
      pAVar6 = local_b0.shared_alloc_.alloc;
      if (((ulong)local_b0.shared_alloc_.alloc & 7) == 0 &&
          local_b0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_b0.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_b0.shared_alloc_.alloc);
          operator_delete(pAVar6,0x48);
        }
      }
      local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_90.ranks.write_.shared_alloc_.alloc = (Alloc *)local_1c8._0_8_;
      if ((local_1c8._0_8_ & 7) == 0 && (Alloc *)local_1c8._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.ranks.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1c8._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_1c8._0_8_ + 0x30) = *(int *)(local_1c8._0_8_ + 0x30) + 1;
        }
      }
      local_90.ranks.write_.shared_alloc_.direct_ptr = (void *)local_1c8._8_8_;
      local_90.idxs.write_.shared_alloc_.alloc = (Alloc *)local_1c8._16_8_;
      if ((local_1c8._16_8_ & 7) == 0 && (Alloc *)local_1c8._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.idxs.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1c8._16_8_ * 8 + 1);
        }
        else {
          *(int *)(local_1c8._16_8_ + 0x30) = *(int *)(local_1c8._16_8_ + 0x30) + 1;
        }
      }
      local_90.idxs.write_.shared_alloc_.direct_ptr = (void *)local_1c8._24_8_;
      Dist::Dist(this,&local_d0,&local_90,local_19c);
      pAVar6 = local_90.idxs.write_.shared_alloc_.alloc;
      if (((ulong)local_90.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.idxs.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90.idxs.write_.shared_alloc_.alloc);
          operator_delete(pAVar6,0x48);
        }
      }
      pAVar6 = local_90.ranks.write_.shared_alloc_.alloc;
      if (((ulong)local_90.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.ranks.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar6);
          operator_delete(pAVar6,0x48);
        }
      }
      if (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((local_1c8._16_8_ & 7) == 0 && (Alloc *)local_1c8._16_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_1c8._16_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_1c8._16_8_);
          operator_delete((void *)local_1c8._16_8_,0x48);
        }
      }
      uVar7 = local_1c8._0_8_;
      if ((local_1c8._0_8_ & 7) == 0 && (Alloc *)local_1c8._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_1c8._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_1c8._0_8_);
          operator_delete((void *)uVar7,0x48);
        }
      }
      if (((ulong)local_180.shared_alloc_.alloc & 7) == 0 &&
          local_180.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_180.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_180.shared_alloc_.alloc);
          operator_delete(local_180.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
          local_170.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_170.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_170.shared_alloc_.alloc);
          operator_delete(local_170.shared_alloc_.alloc,0x48);
        }
      }
      return this;
    }
    pcVar11 = "a % b == 0";
    pcVar8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
    ;
    uVar7 = 0x11a;
  }
  else {
    pcVar11 = "comm->size() % 2 == 0";
    pcVar8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_bipart.cpp"
    ;
    uVar7 = 10;
  }
  fail("assertion %s failed at %s +%d\n",pcVar11,pcVar8,uVar7);
}

Assistant:

Dist bi_partition(CommPtr comm, Read<I8> marks) {
  OMEGA_H_CHECK_MSG(comm->size() % 2 == 0, "To use bi_partiion, please run with an even number of MPI ranks.");
  auto halfsize = divide_no_remainder(comm->size(), 2);
  Write<I32> dest_ranks(marks.size());
  Write<LO> dest_idxs(marks.size());
  LO linsize = -1;
  I32 rank_start = 0;
  for (Int half = 0; half < 2; ++half) {
    marks = invert_marks(marks);
    auto marked = collect_marked(marks);
    auto total = comm->allreduce(GO(marked.size()), OMEGA_H_SUM);
    auto start = comm->exscan(GO(marked.size()), OMEGA_H_SUM);
    Read<GO> globals(marked.size(), start, 1);
    auto owners = globals_to_linear_owners(globals, total, halfsize);
    map_into(add_to_each(owners.ranks, rank_start), marked, dest_ranks, 1);
    map_into(owners.idxs, marked, dest_idxs, 1);
    if (rank_start <= comm->rank() && comm->rank() < (rank_start + halfsize)) {
      linsize =
          linear_partition_size(total, halfsize, comm->rank() - rank_start);
    }
    rank_start += halfsize;
  }
  auto dests = Remotes(Read<I32>(dest_ranks), Read<LO>(dest_idxs));
  return Dist(comm, dests, linsize);
}